

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  unsigned_short *puVar6;
  int *piVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uchar *puVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uchar *puVar19;
  uint uVar20;
  uchar *puVar21;
  ulong uVar22;
  uint uVar23;
  uchar *puVar24;
  size_t sVar25;
  uint uVar26;
  size_t left_1;
  ulong uVar27;
  uint uVar28;
  size_t left;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  uint local_c4;
  ulong local_b0;
  ulong local_60;
  
  uVar10 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar10 = windowsize;
  }
  uVar16 = 0x40;
  if (0x1fff < windowsize) {
    uVar16 = 0x102;
  }
  local_c4 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar11 = windowsize - 1;
    local_c4 = 0x5a;
    if ((windowsize & uVar11) == 0) {
      uVar20 = 0x102;
      if (nicematch < 0x102) {
        uVar20 = nicematch;
      }
      local_c4 = 0;
      if (inpos < insize) {
        puVar14 = in + insize;
        local_60 = 0;
        uVar8 = 0;
        bVar9 = false;
        uVar23 = 0;
        local_c4 = 0;
        do {
          uVar12 = getHash(in,insize,inpos);
          uVar27 = 0;
          if (uVar12 == 0) {
            if (uVar23 == 0) {
              puVar21 = in + inpos + 0x102;
              if (puVar14 < in + inpos + 0x102) {
                puVar21 = puVar14;
              }
              for (puVar19 = in + inpos; (puVar19 != puVar21 && (*puVar19 == '\0'));
                  puVar19 = puVar19 + 1) {
              }
              uVar27 = (ulong)(uint)((int)puVar19 - (int)(in + inpos));
            }
            else {
              if ((insize < uVar23 + inpos) || (in[(uVar23 + inpos) - 1] != '\0')) {
                uVar23 = uVar23 - 1;
              }
              uVar27 = (ulong)uVar23;
            }
          }
          uVar23 = (uint)uVar27;
          uVar26 = (uint)inpos & uVar11;
          uVar15 = (ulong)uVar26;
          piVar4 = hash->val;
          piVar4[uVar15] = uVar12;
          piVar5 = hash->head;
          if (piVar5[uVar12] != -1) {
            hash->chain[uVar15] = (unsigned_short)piVar5[uVar12];
          }
          piVar5[uVar12] = uVar26;
          puVar6 = hash->zeros;
          puVar6[uVar15] = (unsigned_short)uVar27;
          piVar7 = hash->headz;
          if (piVar7[uVar27 & 0xffff] != -1) {
            hash->chainz[uVar15] = (unsigned_short)piVar7[uVar27 & 0xffff];
          }
          uVar30 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar30 = insize;
          }
          piVar7[uVar27 & 0xffff] = uVar26;
          if (uVar10 == 0) {
            local_b0 = 0;
            uVar26 = 0;
          }
          else {
            puVar21 = in + inpos;
            uVar26 = 0;
            local_b0 = 0;
            uVar17 = 0;
            uVar18 = (ulong)hash->chain[uVar15];
            uVar13 = 1;
            do {
              uVar22 = 0;
              if (uVar15 < uVar18) {
                uVar22 = (ulong)windowsize;
              }
              uVar22 = (uVar15 - uVar18) + uVar22;
              if ((uint)uVar22 < (uint)uVar17) break;
              if (uVar22 != 0) {
                puVar24 = in + (inpos - (uVar22 & 0xffffffff));
                puVar19 = puVar21;
                if (2 < uVar23) {
                  uVar17 = (ulong)(uint)puVar6[uVar18];
                  if (uVar23 < puVar6[uVar18]) {
                    uVar17 = uVar27;
                  }
                  puVar24 = puVar24 + uVar17;
                  puVar19 = puVar21 + uVar17;
                }
                for (; (puVar19 != in + uVar30 && (*puVar24 == *puVar19)); puVar24 = puVar24 + 1) {
                  puVar19 = puVar19 + 1;
                }
                uVar28 = (int)puVar19 - (int)puVar21;
                if ((uVar26 < uVar28) &&
                   (local_b0 = uVar22 & 0xffffffff, uVar26 = uVar28, uVar20 <= uVar28)) {
                  local_b0 = uVar22 & 0xffffffff;
                  break;
                }
              }
              uVar2 = hash->chain[uVar18];
              uVar29 = (ulong)uVar2;
              if ((ushort)uVar18 == uVar2) break;
              if ((uVar23 < 3) || (uVar26 <= uVar23)) {
                if (piVar4[uVar2] != uVar12) break;
              }
              else {
                uVar29 = (ulong)hash->chainz[uVar18];
                if (uVar23 != puVar6[uVar29]) break;
              }
              bVar31 = uVar13 != uVar10;
              uVar17 = uVar22;
              uVar18 = uVar29;
              uVar13 = uVar13 + 1;
            } while (bVar31);
          }
          if (lazymatching == 0) goto LAB_0011944f;
          if (((!bVar9) && (2 < uVar26)) && (uVar26 <= uVar16 && uVar26 < 0x102)) {
            bVar31 = true;
            bVar9 = true;
            local_60 = local_b0;
            uVar8 = uVar26;
            goto LAB_001197f2;
          }
          if (!bVar9) {
            bVar9 = false;
            goto LAB_0011944f;
          }
          if (inpos == 0) {
            bVar9 = false;
            local_c4 = 0x51;
            inpos = 0;
LAB_001197f0:
            bVar31 = false;
          }
          else {
            if (uVar8 + 1 < uVar26) {
              bVar1 = in[inpos - 1];
              uVar12 = uivector_resize(out,out->size + 1);
              if (uVar12 != 0) {
                out->data[out->size - 1] = (uint)bVar1;
                bVar9 = false;
                goto LAB_0011944f;
              }
              bVar9 = false;
LAB_001197e8:
              local_c4 = 0x53;
              goto LAB_001197f0;
            }
            piVar5[uVar12] = -1;
            piVar7[uVar27] = -1;
            inpos = inpos - 1;
            bVar9 = false;
            local_b0._0_4_ = (uint)local_60;
            uVar26 = uVar8;
LAB_0011944f:
            if ((uVar26 < 3) || ((uint)local_b0 <= windowsize)) {
              if (((uVar26 < 3) || (uVar26 < minmatch)) ||
                 ((uVar26 == 3 && (0x1000 < (uint)local_b0)))) {
                bVar1 = in[inpos];
                uVar12 = uivector_resize(out,out->size + 1);
                if (uVar12 == 0) goto LAB_001197e8;
                out->data[out->size - 1] = (uint)bVar1;
                bVar31 = true;
              }
              else {
                uVar15 = 0x1c;
                uVar30 = 1;
                do {
                  uVar17 = uVar15 + uVar30 >> 1;
                  if (LENGTHBASE[uVar17] < uVar26) {
                    uVar30 = uVar17 + 1;
                  }
                  else {
                    uVar15 = uVar17 - 1;
                  }
                } while (uVar30 <= uVar15);
                if ((0x1c < uVar30) || (uVar26 < LENGTHBASE[uVar30])) {
                  uVar30 = uVar30 - 1;
                }
                uVar23 = LENGTHBASE[uVar30 & 0xffffffff];
                uVar15 = 0x1d;
                uVar17 = 1;
                do {
                  uVar18 = uVar15 + uVar17 >> 1;
                  if (DISTANCEBASE[uVar18] < (uint)local_b0) {
                    uVar17 = uVar18 + 1;
                  }
                  else {
                    uVar15 = uVar18 - 1;
                  }
                } while (uVar17 <= uVar15);
                if ((0x1d < uVar17) || ((uint)local_b0 < DISTANCEBASE[uVar17])) {
                  uVar17 = uVar17 - 1;
                }
                uVar12 = DISTANCEBASE[uVar17 & 0xffffffff];
                uVar13 = uivector_resize(out,out->size + 1);
                if (uVar13 != 0) {
                  out->data[out->size - 1] = (int)uVar30 + 0x101;
                }
                uVar13 = uivector_resize(out,out->size + 1);
                if (uVar13 != 0) {
                  out->data[out->size - 1] = uVar26 - uVar23;
                }
                uVar23 = uivector_resize(out,out->size + 1);
                if (uVar23 != 0) {
                  out->data[out->size - 1] = (uint)uVar17;
                }
                uVar23 = uivector_resize(out,out->size + 1);
                if (uVar23 != 0) {
                  out->data[out->size - 1] = (uint)local_b0 - uVar12;
                }
                piVar4 = hash->head;
                piVar5 = hash->val;
                puVar6 = hash->zeros;
                piVar7 = hash->headz;
                if (uVar26 < 3) {
                  uVar26 = 2;
                }
                uVar12 = 1;
                sVar25 = inpos;
                do {
                  inpos = sVar25 + 1;
                  uVar13 = getHash(in,insize,inpos);
                  uVar15 = 0;
                  if (uVar13 == 0) {
                    if ((int)uVar27 == 0) {
                      puVar21 = in + sVar25 + 0x103;
                      if (puVar14 < in + sVar25 + 0x103) {
                        puVar21 = puVar14;
                      }
                      for (puVar19 = in + inpos; (puVar19 != puVar21 && (*puVar19 == '\0'));
                          puVar19 = puVar19 + 1) {
                      }
                      uVar15 = (ulong)(uint)((int)puVar19 - (int)(in + inpos));
                    }
                    else if ((insize < inpos + uVar27) ||
                            (uVar15 = uVar27, in[uVar27 + sVar25] != '\0')) {
                      uVar15 = (ulong)((int)uVar27 - 1);
                    }
                  }
                  uVar23 = (uint)uVar15;
                  uVar28 = (uint)inpos & uVar11;
                  piVar5[uVar28] = uVar13;
                  iVar3 = piVar4[uVar13];
                  if (iVar3 != -1) {
                    hash->chain[uVar28] = (unsigned_short)iVar3;
                  }
                  piVar4[uVar13] = uVar28;
                  puVar6[uVar28] = (unsigned_short)uVar15;
                  iVar3 = piVar7[uVar15 & 0xffff];
                  if (iVar3 != -1) {
                    hash->chainz[uVar28] = (unsigned_short)iVar3;
                  }
                  piVar7[uVar15 & 0xffff] = uVar28;
                  uVar12 = uVar12 + 1;
                  sVar25 = inpos;
                  uVar27 = uVar15;
                } while (uVar12 != uVar26);
                bVar31 = true;
              }
            }
            else {
              bVar31 = false;
              local_c4 = 0x56;
            }
          }
LAB_001197f2:
        } while ((bVar31) && (inpos = inpos + 1, inpos < insize));
      }
    }
  }
  return local_c4;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching) {
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8u;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos) {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0) {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    } else {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;) {
      if(chainlength++ >= maxchainlength) break;
      current_offset = (unsigned)(hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize);

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0) {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3) {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/ {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length) {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros) {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      } else {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching) {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH) {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy) {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1) {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        } else {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/ {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    } else if(length < minmatch || (length == 3 && offset > 4096)) {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    } else {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i) {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0) {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        } else {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}